

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O0

void __thiscall cpprofiler::Connector::sendNode(Connector *this,Node *node)

{
  NodeUID node_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  NodeStatus NVar4;
  Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pOVar5;
  Node *in_RSI;
  Connector *in_RDI;
  NodeUID NVar6;
  NodeUID NVar7;
  Message *msg;
  undefined4 in_stack_ffffffffffffff4c;
  int32_t in_stack_ffffffffffffff54;
  MessageMarshalling *in_stack_ffffffffffffff58;
  Connector *this_00;
  int32_t in_stack_ffffffffffffff94;
  int32_t local_30;
  
  if ((in_RDI->_connected & 1U) != 0) {
    this_00 = in_RDI;
    NVar6 = Node::nodeUID(in_RSI);
    local_30 = NVar6.tid;
    NVar7 = Node::parentUID(in_RSI);
    iVar2 = Node::alt(in_RSI);
    iVar3 = Node::kids(in_RSI);
    NVar4 = Node::status(in_RSI);
    node_00.tid = in_stack_ffffffffffffff94;
    node_00.nid = (int)NVar7._4_8_;
    node_00.rid = (int)((ulong)NVar7._4_8_ >> 0x20);
    NVar6.tid = iVar2;
    NVar6._0_8_ = in_RDI;
    MessageMarshalling::makeNode
              (in_stack_ffffffffffffff58,node_00,NVar6,in_stack_ffffffffffffff54,local_30,NVar7.nid)
    ;
    pOVar5 = Node::label_abi_cxx11_(in_RSI);
    bVar1 = Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::valid(pOVar5);
    if (bVar1) {
      pOVar5 = Node::label_abi_cxx11_(in_RSI);
      Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value(pOVar5);
      Message::set_label((Message *)CONCAT44(in_stack_ffffffffffffff54,NVar4),
                         (string *)CONCAT44(in_stack_ffffffffffffff4c,iVar3));
    }
    pOVar5 = Node::nogood_abi_cxx11_(in_RSI);
    bVar1 = Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::valid(pOVar5);
    if (bVar1) {
      pOVar5 = Node::nogood_abi_cxx11_(in_RSI);
      Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value(pOVar5);
      Message::set_nogood((Message *)CONCAT44(in_stack_ffffffffffffff54,NVar4),
                          (string *)CONCAT44(in_stack_ffffffffffffff4c,iVar3));
    }
    pOVar5 = Node::info_abi_cxx11_(in_RSI);
    bVar1 = Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::valid(pOVar5);
    if (bVar1) {
      pOVar5 = Node::info_abi_cxx11_(in_RSI);
      Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      value(pOVar5);
      Message::set_info((Message *)CONCAT44(in_stack_ffffffffffffff54,NVar4),
                        (string *)CONCAT44(in_stack_ffffffffffffff4c,iVar3));
    }
    sendOverSocket(this_00);
  }
  return;
}

Assistant:

void sendNode(const Node& node) {
    if (!_connected) return;

    auto& msg = marshalling.makeNode(node.nodeUID(), node.parentUID(),
                                     node.alt(), node.kids(), node.status());

    if (node.label().valid()) msg.set_label(node.label().value());
    if (node.nogood().valid()) msg.set_nogood(node.nogood().value());
    if (node.info().valid()) msg.set_info(node.info().value());

    sendOverSocket();
  }